

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_ktx_texture.cpp
# Opt level: O1

uint8_vec * __thiscall crnlib::ktx_texture::find_key(ktx_texture *this,char *pKey)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ktx_texture *pkVar5;
  
  sVar3 = strlen(pKey);
  uVar4 = (ulong)(this->m_key_values).m_size;
  if (uVar4 != 0) {
    pkVar5 = (ktx_texture *)(this->m_key_values).m_p;
    do {
      if (((ulong)*(uint *)((long)(pkVar5->m_header).m_identifier + 8) < sVar3 + 1) ||
         (iVar2 = bcmp(*(uchar **)(pkVar5->m_header).m_identifier,pKey,sVar3 + 1), iVar2 != 0)) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
        this = pkVar5;
      }
      if (!bVar1) {
        return (uint8_vec *)this;
      }
      pkVar5 = (ktx_texture *)&(pkVar5->m_header).m_glType;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return (uint8_vec *)0x0;
}

Assistant:

const uint8_vec* ktx_texture::find_key(const char* pKey) const
    {
        const size_t n = strlen(pKey) + 1;
        for (uint i = 0; i < m_key_values.size(); i++)
        {
            const uint8_vec& v = m_key_values[i];
            if ((v.size() >= n) && (!memcmp(&v[0], pKey, n)))
            {
                return &v;
            }
        }

        return nullptr;
    }